

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

JSON_VALUE * json_parse(char *input)

{
  uint uVar1;
  JSON_VALUE *pJVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  void *pvVar6;
  JSON_VALUE *pJVar7;
  char *pcVar8;
  JSON_VALUE **ppJVar9;
  int iVar10;
  long lVar11;
  uint *puVar12;
  JSON_TYPE JVar13;
  ulong uVar14;
  ulong uVar15;
  JSON_BUFFER local_98;
  ulong local_80;
  JSON_VALUE *stack [8];
  
  local_80 = strlen(input);
  uVar14 = 0;
  iVar10 = 0;
LAB_00103406:
  if (local_80 <= uVar14) {
    return stack[0];
  }
  pcVar8 = (char *)0x0;
LAB_00103418:
  do {
    pcVar5 = pcVar8;
    uVar15 = uVar14;
    cVar3 = input[uVar15];
    pvVar6 = memchr(" \t\r\n",(int)cVar3,5);
    uVar14 = uVar15 + 1;
    pcVar8 = pcVar5;
  } while (pvVar6 != (void *)0x0);
  if (cVar3 == '\"') {
    local_98.buf = (char *)0x0;
    local_98.n = 0;
    local_98.alloced = 0;
    do {
      cVar3 = input[uVar14];
      if (cVar3 == '\\') {
        cVar3 = input[uVar14 + 1];
        if ((cVar3 == '\"') || (cVar3 == '\\')) {
LAB_0010348e:
          lVar11 = 2;
          goto LAB_00103491;
        }
        if (cVar3 == 'n') {
          cVar3 = '\n';
          goto LAB_0010348e;
        }
        if (cVar3 == 't') {
          cVar3 = '\t';
          goto LAB_0010348e;
        }
        lVar11 = 2;
        if (cVar3 == 'r') {
          cVar3 = '\r';
          goto LAB_00103491;
        }
      }
      else {
        lVar11 = 1;
        if (cVar3 == '\"') goto LAB_001034a1;
LAB_00103491:
        json_append(&local_98,cVar3);
      }
      uVar14 = uVar14 + lVar11;
    } while( true );
  }
  if (cVar3 == ',') {
LAB_0010353a:
    pJVar7 = (JSON_VALUE *)0x0;
    uVar15 = uVar14;
  }
  else if (cVar3 == '[') {
    JVar13 = JSON_ARRAY;
LAB_00103558:
    pJVar7 = json_alloc_value(JVar13);
    uVar15 = uVar14;
  }
  else {
    if (cVar3 == ']') {
LAB_0010352e:
      iVar10 = iVar10 + -1;
      goto LAB_0010353a;
    }
    if (cVar3 == 'f') {
      pJVar7 = json_alloc_value(JSON_FALSE);
      uVar15 = uVar15 + 5;
    }
    else if (cVar3 == 'n') {
      JVar13 = JSON_NULL;
LAB_00103548:
      pJVar7 = json_alloc_value(JVar13);
      uVar15 = uVar15 + 4;
    }
    else {
      if (cVar3 == 't') {
        JVar13 = JSON_TRUE;
        goto LAB_00103548;
      }
      if (cVar3 == '}') goto LAB_0010352e;
      if (cVar3 == '{') {
        JVar13 = JSON_OBJECT;
        goto LAB_00103558;
      }
      local_98.buf = (char *)0x0;
      local_98.n = 0;
      local_98.alloced = 0;
      while (pvVar6 = memchr(" \t\r\n,]}",(int)cVar3,8), pvVar6 == (void *)0x0) {
        json_append(&local_98,cVar3);
        cVar3 = input[uVar15 + 1];
        uVar15 = uVar15 + 1;
      }
      json_append(&local_98,'\0');
      pcVar8 = local_98.buf;
      pJVar7 = json_alloc_value(JSON_STRING);
      (pJVar7->data).str = pcVar8;
    }
  }
  goto LAB_001035cb;
LAB_001034a1:
  json_append(&local_98,'\0');
  pcVar8 = local_98.buf;
  uVar14 = uVar14 + 1;
  do {
    uVar15 = uVar14;
    cVar3 = input[uVar15];
    pvVar6 = memchr(" \t\r\n",(int)cVar3,5);
    uVar14 = uVar15 + 1;
  } while (pvVar6 != (void *)0x0);
  if (cVar3 != ':') goto code_r0x001034e2;
  goto LAB_00103418;
code_r0x001034e2:
  pJVar7 = json_alloc_value(JSON_STRING);
  (pJVar7->data).str = pcVar8;
LAB_001035cb:
  uVar14 = uVar15 - 1;
  do {
    pvVar6 = memchr(" \t\r\n",(int)input[uVar14 + 1],5);
    uVar14 = uVar14 + 1;
  } while (pvVar6 != (void *)0x0);
  if (pJVar7 == (JSON_VALUE *)0x0) goto LAB_00103406;
  if (iVar10 < 1) goto LAB_001036c7;
  pJVar2 = stack[iVar10 - 1];
  if (pcVar5 == (char *)0x0) {
    if (pJVar2->type != JSON_ARRAY) goto LAB_001036c7;
    puVar12 = &(pJVar2->data).array.n;
    uVar4 = (pJVar2->data).array.n;
    uVar1 = (pJVar2->data).array.alloced;
    ppJVar9 = (JSON_VALUE **)(pJVar2->data).str;
    if (uVar1 <= uVar4) {
      uVar15 = (ulong)(uVar1 * 2);
      if (uVar1 == 0) {
        uVar15 = 4;
      }
      (pJVar2->data).array.alloced = (uint)uVar15;
      ppJVar9 = (JSON_VALUE **)realloc(ppJVar9,uVar15 << 5);
      (pJVar2->data).str = (char *)ppJVar9;
      goto LAB_001036b8;
    }
  }
  else {
    if (pJVar2->type != JSON_OBJECT) goto LAB_001036c7;
    uVar1 = (pJVar2->data).obj.alloced;
    uVar4 = (pJVar2->data).obj.n;
    if (uVar1 <= uVar4) {
      uVar15 = (ulong)(uVar1 * 2);
      if (uVar1 == 0) {
        uVar15 = 4;
      }
      (pJVar2->data).obj.alloced = (uint)uVar15;
      pcVar8 = (char *)realloc((pJVar2->data).str,uVar15 << 3);
      (pJVar2->data).str = pcVar8;
      ppJVar9 = (JSON_VALUE **)
                realloc((pJVar2->data).obj.values,(ulong)(pJVar2->data).obj.alloced << 5);
      (pJVar2->data).obj.values = ppJVar9;
      uVar4 = (pJVar2->data).obj.n;
    }
    puVar12 = &(pJVar2->data).obj.n;
    *(char **)((pJVar2->data).str + (ulong)uVar4 * 8) = pcVar5;
    ppJVar9 = (pJVar2->data).obj.values;
LAB_001036b8:
    uVar4 = *puVar12;
  }
  ppJVar9[uVar4] = pJVar7;
  *puVar12 = *puVar12 + 1;
LAB_001036c7:
  if ((pJVar7->type == JSON_OBJECT) || (iVar10 == 0 || pJVar7->type == JSON_ARRAY)) {
    stack[iVar10] = pJVar7;
    iVar10 = iVar10 + 1;
  }
  goto LAB_00103406;
}

Assistant:

JSON_VALUE*
json_parse(const char* input)
{
    off_t off = 0;
    size_t len;
    JSON_VALUE* stack[8];
    int stack_top = 0;

    len = strlen(input);

    while(off < len) {
        char* key = NULL;
        JSON_VALUE* v = NULL;

after_key:
        while(strchr(" \t\r\n", input[off]) != NULL)
            off++;

        switch(input[off]) {
            case '{':
                v = json_alloc_value(JSON_OBJECT);
                off++;
                break;

            case '[':
                v = json_alloc_value(JSON_ARRAY);
                off++;
                break;

            case 'n':
                v = json_alloc_value(JSON_NULL);
                off += strlen("null");
                break;

            case 'f':
                v = json_alloc_value(JSON_FALSE);
                off += strlen("false");
                break;

            case 't':
                v = json_alloc_value(JSON_TRUE);
                off += strlen("true");
                break;

            case ']':
            case '}':
                off++;
                stack_top--;
                break;

            case ',':
                off++;
                break;

            case '"':
            {
                char* str;

                off = json_create_string(input, off, &str);

                while(strchr(" \t\r\n", input[off]) != NULL)
                    off++;
                if(input[off] == ':') {
                    off++;
                    key = str;
                    goto after_key;
                } else {
                    v = json_alloc_value(JSON_STRING);
                    v->data.str = str;
                }
                break;
            }

            default:
            {
                char* str;

                off = json_create_unqoted_string(input, off, &str);
                v = json_alloc_value(JSON_STRING);
                v->data.str = str;
                break;
            }
        }

        while(strchr(" \t\r\n", input[off]) != NULL)
            off++;

        if(v != NULL) {
            if(stack_top > 0)
                json_add_value(stack[stack_top-1], key, v);

            if(v->type == JSON_OBJECT || v->type == JSON_ARRAY || stack_top == 0) {
                stack[stack_top] = v;
                stack_top++;
            }
        }
    }

    return stack[0];
}